

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HdmiCecSimulationDataGenerator.cpp
# Opt level: O0

void __thiscall
HdmiCecSimulationDataGenerator::GenDataBlock
          (HdmiCecSimulationDataGenerator *this,U8 data,bool eom,bool ack)

{
  int local_18;
  int i;
  bool ack_local;
  bool eom_local;
  U8 data_local;
  HdmiCecSimulationDataGenerator *this_local;
  
  for (local_18 = 7; -1 < local_18; local_18 = local_18 + -1) {
    GenBit(this,((int)(uint)data >> ((byte)local_18 & 0x1f) & 1U) != 0,false);
  }
  if (this->mErrorType == ERR_NOEOM) {
    this->mErrorType = ERR_NOERROR;
  }
  else {
    GenBit(this,eom,false);
  }
  if (this->mErrorType == ERR_NOACK) {
    this->mErrorType = ERR_NOERROR;
  }
  else {
    GenBit(this,ack,true);
  }
  return;
}

Assistant:

void HdmiCecSimulationDataGenerator::GenDataBlock( U8 data, bool eom, bool ack )
{
    for( int i = 7; i >= 0; i-- )
        GenBit( ( data >> i ) & 0x1 );

    if( mErrorType != ERR_NOEOM )
        GenBit( eom );
    else
        mErrorType = ERR_NOERROR;

    if( mErrorType != ERR_NOACK )
        GenBit( ack, true );
    else
        mErrorType = ERR_NOERROR;
}